

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

StringResult<long_long> __thiscall
QCborStreamReader::readStringChunk(QCborStreamReader *this,char *ptr,qsizetype maxlen)

{
  Code CVar1;
  qsizetype in_RDX;
  QCborStreamReaderPrivate *in_RSI;
  QCborStreamReader *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  StringResult<long_long> SVar3;
  ReadStringChunk in_stack_00000000;
  StringResult<long_long> r;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Code local_3c;
  longlong local_38;
  StringResultCode local_30;
  ReadStringChunk local_28;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
  operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_> *
             )0x8d6b1a);
  QCborStreamReaderPrivate::ReadStringChunk::ReadStringChunk(&local_28,(char *)in_RSI,in_RDX);
  SVar3 = QCborStreamReaderPrivate::readStringChunk(in_RSI,in_stack_00000000);
  local_38 = SVar3.data;
  local_30 = SVar3.status;
  puStack_10 = (undefined1 *)CONCAT44(puStack_10._4_4_,local_30);
  bVar2 = false;
  local_18 = (undefined1 *)local_38;
  if (local_30 == EndOfString) {
    local_3c = (Code)lastError((QCborStreamReader *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    CVar1 = QCborError::operator_cast_to_Code((QCborError *)&local_3c);
    bVar2 = CVar1 == NoError;
  }
  if (bVar2) {
    preparse(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  SVar3.status = puStack_10._0_4_;
  SVar3.data = (longlong)local_18;
  SVar3._12_4_ = 0;
  return SVar3;
}

Assistant:

QCborStreamReader::StringResult<qsizetype>
QCborStreamReader::readStringChunk(char *ptr, qsizetype maxlen)
{
    auto r = d->readStringChunk({ptr, maxlen});
    if (r.status == EndOfString && lastError() == QCborError::NoError)
        preparse();
    return r;
}